

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDH.cpp
# Opt level: O1

bool __thiscall
OSSLECDH::reconstructPrivateKey(OSSLECDH *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  char cVar1;
  size_t sVar2;
  OSSLECPrivateKey *this_00;
  
  if ((ppPrivateKey != (PrivateKey **)0x0) && (sVar2 = ByteString::size(serialisedData), sVar2 != 0)
     ) {
    this_00 = (OSSLECPrivateKey *)operator_new(0x60);
    OSSLECPrivateKey::OSSLECPrivateKey(this_00);
    cVar1 = (**(code **)(*(long *)&this_00->super_ECPrivateKey + 0x68))(this_00,serialisedData);
    if (cVar1 != '\0') {
      *ppPrivateKey = (PrivateKey *)this_00;
      return (bool)cVar1;
    }
    (**(code **)(*(long *)&this_00->super_ECPrivateKey + 0x10))(this_00);
    return false;
  }
  return false;
}

Assistant:

bool OSSLECDH::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLECPrivateKey* priv = new OSSLECPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}